

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void rec_comp_fixup(jit_State *J,BCIns *pc,int cond)

{
  ushort uVar1;
  BCReg maxslot;
  BCReg BVar2;
  uint32_t uVar3;
  SnapShot *pSVar4;
  SnapEntry *pSVar5;
  uint uVar6;
  BCReg BVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint8_t auStack_138 [264];
  
  lVar12 = 0;
  if (cond != 0) {
    lVar12 = (ulong)(pc[1] >> 0x10) - 0x8000;
  }
  uVar6 = pc[1] >> 8 & 0xff;
  uVar9 = (ulong)(J->cur).nsnap;
  pSVar4 = (J->cur).snap;
  pSVar5 = (J->cur).snapmap;
  uVar13 = (uint)pSVar4[uVar9 - 1].nent + pSVar4[uVar9 - 1].mapofs;
  *(ulong *)(pSVar5 + uVar13) = (long)(pc + lVar12) * 0x100 + (ulong)(byte)pSVar5[uVar13] + 0x800;
  J->needsnap = '\x01';
  if (J->maxslot <= uVar6) {
    pSVar4 = (J->cur).snap;
    uVar1 = (J->cur).nsnap;
    uVar6 = pSVar4[(ulong)uVar1 - 1].mapofs;
    pSVar5 = (J->cur).snapmap;
    uVar9 = (ulong)pSVar4[(ulong)uVar1 - 1].nent;
    maxslot = J->maxslot;
    BVar2 = J->baseslot;
    BVar7 = snap_usedef(J,auStack_138,(BCIns *)(*(ulong *)(pSVar5 + uVar6 + uVar9) >> 8),maxslot);
    if (BVar7 < maxslot) {
      snap_useuv(J->pt,auStack_138);
    }
    pSVar4[(ulong)uVar1 - 1].nslots = (uint8_t)(maxslot + BVar2);
    if (uVar9 == 0) {
      uVar13 = 0;
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      uVar13 = 0;
      do {
        uVar10 = pSVar5[uVar6 + uVar8] >> 0x18;
        if ((uVar10 < BVar7 + BVar2) ||
           ((uVar10 < maxslot + BVar2 && (auStack_138[uVar10 - BVar2] == '\0')))) {
          uVar11 = (ulong)uVar13;
          uVar13 = uVar13 + 1;
          pSVar5[uVar6 + uVar11] = pSVar5[uVar6 + uVar8];
        }
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    pSVar4[(ulong)uVar1 - 1].nent = (uint8_t)uVar13;
    uVar10 = pSVar4[(ulong)uVar1 - 1].mapofs;
    uVar3 = (J->cur).nsnapmap;
    for (; (uint)uVar8 <= ~uVar10 + uVar3; uVar8 = (ulong)((uint)uVar8 + 1)) {
      uVar9 = (ulong)uVar13;
      uVar13 = uVar13 + 1;
      pSVar5[uVar6 + uVar9] = pSVar5[(ulong)uVar6 + (uVar8 & 0xffffffff)];
    }
    (J->cur).nsnapmap = uVar13 + pSVar4[(ulong)uVar1 - 1].mapofs;
    return;
  }
  J->maxslot = uVar6;
  lj_snap_shrink(J);
  return;
}

Assistant:

static void rec_comp_fixup(jit_State *J, const BCIns *pc, int cond)
{
  BCIns jmpins = pc[1];
  const BCIns *npc = pc + 2 + (cond ? bc_j(jmpins) : 0);
  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
  /* Set PC to opposite target to avoid re-recording the comp. in side trace. */
#if LJ_FR2
  SnapEntry *flink = &J->cur.snapmap[snap->mapofs + snap->nent];
  uint64_t pcbase;
  memcpy(&pcbase, flink, sizeof(uint64_t));
  pcbase = (pcbase & 0xff) | (u64ptr(npc) << 8);
  memcpy(flink, &pcbase, sizeof(uint64_t));
#else
  J->cur.snapmap[snap->mapofs + snap->nent] = SNAP_MKPC(npc);
#endif
  J->needsnap = 1;
  if (bc_a(jmpins) < J->maxslot) J->maxslot = bc_a(jmpins);
  lj_snap_shrink(J);  /* Shrink last snapshot if possible. */
}